

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O3

pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_vec_fil>_>_>_*,_true>,_bool>
 __thiscall
Gudhi::Simplex_tree<Simplex_tree_vec_fil>::insert_simplex_and_subfaces<std::initializer_list<int>>
          (Simplex_tree<Simplex_tree_vec_fil> *this,initializer_list<int> *Nsimplex,
          Filtration_value *filtration)

{
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  Filtration_value *pFVar7;
  undefined1 *puVar8;
  undefined8 *puVar9;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var10;
  Filtration_value *pFVar11;
  const_iterator __cbeg;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last;
  Filtration_value *filt;
  long *in_FS_OFFSET;
  pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_vec_fil>_>_>_*,_true>,_bool>
  pVar12;
  
  piVar2 = (filtration->super_vector<int,_std::allocator<int>_>).
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
  if (piVar2 == (pointer)0x0) {
    (this->nodes_label_to_list_)._M_h._M_buckets = (__buckets_ptr)0x0;
    *(undefined1 *)&(this->nodes_label_to_list_)._M_h._M_bucket_count = 1;
  }
  else {
    piVar3 = (filtration->super_vector<int,_std::allocator<int>_>).
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    if ((char)in_FS_OFFSET[-5] == '\0') {
      insert_simplex_and_subfaces<std::initializer_list<int>>();
    }
    lVar4 = in_FS_OFFSET[-8];
    if (in_FS_OFFSET[-7] != lVar4) {
      in_FS_OFFSET[-7] = lVar4;
    }
    std::vector<int,std::allocator<int>>::_M_range_insert<int_const*>
              ((vector<int,std::allocator<int>> *)(*in_FS_OFFSET + -0x40),lVar4,piVar3,
               piVar3 + (long)piVar2);
    last._M_current = (int *)in_FS_OFFSET[-8];
    filt = (Filtration_value *)in_FS_OFFSET[-7];
    if ((Filtration_value *)last._M_current != filt) {
      uVar6 = (long)filt - (long)last._M_current >> 2;
      lVar4 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (last._M_current,filt,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (last._M_current,filt);
      last._M_current = (int *)in_FS_OFFSET[-8];
      filt = (Filtration_value *)in_FS_OFFSET[-7];
    }
    if ((Filtration_value *)last._M_current != filt) {
      pFVar11 = (Filtration_value *)(last._M_current + 1);
      do {
        pFVar7 = pFVar11;
        if (pFVar7 == filt) goto LAB_0010aafb;
        iVar5 = *(int *)((long)&pFVar7[-1].super_vector<int,_std::allocator<int>_>.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage + 4);
        pFVar11 = (Filtration_value *)
                  ((long)&(pFVar7->super_vector<int,_std::allocator<int>_>).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start + 4);
      } while (iVar5 != *(int *)&(pFVar7->super_vector<int,_std::allocator<int>_>).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start);
      puVar8 = (undefined1 *)
               ((long)&pFVar7[-1].super_vector<int,_std::allocator<int>_>.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_end_of_storage + 4);
      for (; pFVar11 != filt;
          pFVar11 = (Filtration_value *)
                    ((long)&(pFVar11->super_vector<int,_std::allocator<int>_>).
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + 4)) {
        iVar1 = *(int *)&(pFVar11->super_vector<int,_std::allocator<int>_>).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
        if (iVar5 != iVar1) {
          *(int *)(puVar8 + 4) = iVar1;
          puVar8 = puVar8 + 4;
        }
        iVar5 = iVar1;
      }
      pFVar11 = (Filtration_value *)(puVar8 + 4);
      if (pFVar11 != filt) {
        in_FS_OFFSET[-7] = (long)pFVar11;
        filt = pFVar11;
      }
    }
LAB_0010aafb:
    if ((Filtration_value *)last._M_current != filt) {
      _Var10._M_current = last._M_current;
      do {
        if (*(int *)&(((Filtration_value *)_Var10._M_current)->
                     super_vector<int,_std::allocator<int>_>).
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start == (int)Nsimplex[3]._M_len) {
          puVar9 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar9 = "cannot use the dummy null_vertex() as a real vertex";
          __cxa_throw(puVar9,&char_const*::typeinfo,0);
        }
        _Var10._M_current =
             (int *)((long)&(((Filtration_value *)_Var10._M_current)->
                            super_vector<int,_std::allocator<int>_>).
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + 4);
      } while ((Filtration_value *)_Var10._M_current != filt);
    }
    iVar5 = (int)((ulong)((long)filt - (long)last._M_current) >> 2) + -1;
    if (iVar5 < *(int *)&Nsimplex[8]._M_array) {
      iVar5 = *(int *)&Nsimplex[8]._M_array;
    }
    *(int *)&Nsimplex[8]._M_array = iVar5;
    pVar12 = rec_insert_simplex_and_subfaces_sorted<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                       (this,(Siblings *)Nsimplex,
                        (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                        (Nsimplex + 4),last,filt);
    filtration = pVar12._8_8_;
  }
  pVar12._8_8_ = filtration;
  pVar12.first.m_ptr =
       (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_vec_fil>_>_>
        *)this;
  return pVar12;
}

Assistant:

std::pair<Simplex_handle, bool> insert_simplex_and_subfaces(
      const InputVertexRange& Nsimplex,
      const Filtration_value& filtration = Filtration_value())
  {
    auto first = std::begin(Nsimplex);
    auto last = std::end(Nsimplex);

    if (first == last)
      return { null_simplex(), true }; // FIXME: false would make more sense to me.

    thread_local std::vector<Vertex_handle> copy;
    copy.clear();
    copy.insert(copy.end(), first, last);
    std::sort(copy.begin(), copy.end());
    auto last_unique = std::unique(copy.begin(), copy.end());
    copy.erase(last_unique, copy.end());
    GUDHI_CHECK_code(
      for (Vertex_handle v : copy)
        GUDHI_CHECK(v != null_vertex(), "cannot use the dummy null_vertex() as a real vertex");
    )
    // Update dimension if needed. We could wait to see if the insertion succeeds, but I doubt there is much to gain.
    dimension_ = (std::max)(dimension_, static_cast<int>(std::distance(copy.begin(), copy.end())) - 1);

    return rec_insert_simplex_and_subfaces_sorted(root(), copy.begin(), copy.end(), filtration);
  }